

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O1

ostream * test_detail::
          print_range<std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>
                    (ostream *stream,_List_const_iterator<unsigned_int> range)

{
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  if ((range._M_node)->_M_next != range._M_node) {
    std::ostream::_M_insert<unsigned_long>((ulong)stream);
    __f.proj = &local_11;
    __f.stream = stream;
    std::
    for_each<std::_List_const_iterator<unsigned_int>,test_detail::print_range<std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>(std::ostream&,std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              ((range._M_node)->_M_next->_M_next,range,__f);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return stream;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }